

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O3

bool __thiscall InsertProxyModelPrivate::commitToSource(InsertProxyModelPrivate *this,bool isRow)

{
  QModelIndex *this_00;
  char cVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long *plVar5;
  reference this_01;
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar6;
  const_iterator alast;
  iterator afirst;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong i;
  size_t asize;
  QModelIndex *pQVar10;
  QVector<int> aggregateRoles;
  QModelIndex currentIdx;
  QModelIndex proxyIdx;
  QArrayData *local_b8;
  quintptr qStack_b0;
  QAbstractItemModel *pQStack_a8;
  ulong local_a0;
  QList<QMap<int,_QVariant>_> *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  QModelIndex local_78;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  this_00 = (QModelIndex *)this->q_ptr;
  lVar4 = QAbstractProxyModel::sourceModel();
  if ((lVar4 != 0) &&
     ((uVar2 = (this->m_insertDirection).i, ((byte)uVar2 & isRow) != 0 ||
      ((uVar2 & 2) != 0 && !isRow)))) {
    plVar5 = (long *)QAbstractProxyModel::sourceModel();
    local_90 = 0xffffffffffffffff;
    local_88 = 0;
    uStack_80 = 0;
    uVar2 = (**(code **)(*plVar5 + 0x80))(plVar5,&local_90);
    plVar5 = (long *)QAbstractProxyModel::sourceModel();
    local_90 = 0xffffffffffffffff;
    local_88 = 0;
    uStack_80 = 0;
    uVar3 = (**(code **)(*plVar5 + 0x78))(plVar5,&local_90);
    plVar5 = (long *)QAbstractProxyModel::sourceModel();
    if (isRow) {
      local_90 = 0xffffffffffffffff;
      local_88 = 0;
      uStack_80 = 0;
      cVar1 = (**(code **)(*plVar5 + 0xf8))(plVar5,uVar3,1);
      uVar7 = uVar2;
    }
    else {
      local_b8 = (QArrayData *)0xffffffffffffffff;
      qStack_b0 = 0;
      pQStack_a8 = (QAbstractItemModel *)0x0;
      cVar1 = (**(code **)(*plVar5 + 0x100))(plVar5,uVar2,1);
      uVar7 = uVar3;
    }
    if (cVar1 != '\0') {
      if ((int)uVar7 < 1) {
        return true;
      }
      local_98 = this->m_extraData + isRow;
      local_a0 = (ulong)uVar7;
      i = 0;
      do {
        this_01 = QList<QMap<int,_QVariant>_>::operator[](local_98,i);
        pQVar6 = (this_01->d).d;
        if ((pQVar6 != (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                        *)0x0) &&
           ((pQVar6->m)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
          plVar5 = (long *)QAbstractProxyModel::sourceModel();
          if (isRow) {
            local_b8 = (QArrayData *)0xffffffffffffffff;
            qStack_b0 = 0;
            pQStack_a8 = (QAbstractItemModel *)0x0;
            lVar4 = *plVar5;
            uVar9 = (ulong)uVar3;
            uVar8 = i & 0xffffffff;
            pQVar10 = (QModelIndex *)&local_b8;
          }
          else {
            local_78.r = -1;
            local_78.c = -1;
            local_78.i = 0;
            local_78.m = (QAbstractItemModel *)0x0;
            lVar4 = *plVar5;
            uVar9 = i & 0xffffffff;
            uVar8 = (ulong)uVar2;
            pQVar10 = &local_78;
          }
          (**(code **)(lVar4 + 0x60))(&local_90,plVar5,uVar9,uVar8,pQVar10);
          plVar5 = (long *)QAbstractProxyModel::sourceModel();
          cVar1 = (**(code **)(*plVar5 + 0xb8))(plVar5,&local_90,this_01);
          if (cVar1 == '\0') {
            return false;
          }
          local_b8 = (QArrayData *)0x0;
          qStack_b0 = 0;
          pQStack_a8 = (QAbstractItemModel *)0x0;
          pQVar6 = (this_01->d).d;
          if (pQVar6 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                         *)0x0) {
            asize = 0;
          }
          else {
            asize = (pQVar6->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
          }
          QList<int>::reserve((QList<int> *)&local_b8,asize);
          QMap<int,_QVariant>::detach(this_01);
          pQVar6 = (this_01->d).d;
          if (pQVar6 != (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                         *)0x0) {
            afirst._M_node = (pQVar6->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            do {
              if ((pQVar6->m)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) break;
              local_78.r = afirst._M_node[1]._M_color;
              QtPrivate::QPodArrayOps<int>::emplace<int&>
                        ((QPodArrayOps<int> *)&local_b8,(qsizetype)pQStack_a8,&local_78.r);
              alast.i._M_node = (const_iterator)std::_Rb_tree_increment(afirst._M_node);
              afirst._M_node = (_Base_ptr)QMap<int,_QVariant>::erase(this_01,afirst._M_node,alast);
              pQVar6 = (this_01->d).d;
            } while (pQVar6 != (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                                *)0x0);
          }
          if (isRow) {
            local_48 = 0xffffffffffffffff;
            local_40 = 0;
            uStack_38 = 0;
            (**(code **)(*(long *)this_00 + 0x60))
                      (&local_78,this_00,uVar3 + 1,i & 0xffffffff,&local_48);
          }
          else {
            local_60 = 0xffffffffffffffff;
            local_58 = 0;
            uStack_50 = 0;
            (**(code **)(*(long *)this_00 + 0x60))
                      (&local_78,this_00,i & 0xffffffff,uVar2 + 1,&local_60);
          }
          QAbstractItemModel::dataChanged(this_00,&local_78,(QList *)&local_78);
          InsertProxyModel::extraDataChanged
                    ((InsertProxyModel *)this_00,&local_78,&local_78,(QVector<int> *)&local_b8);
          if (local_b8 != (QArrayData *)0x0) {
            LOCK();
            (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_b8,4,8);
            }
          }
        }
        i = i + 1;
        if (i == local_a0) {
          return true;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool InsertProxyModelPrivate::commitToSource(const bool isRow)
{
    Q_Q(InsertProxyModel);
    if (!q->sourceModel())
        return false;
    const bool canInsCol = m_insertDirection & InsertProxyModel::InsertColumn;
    const bool canInsRow = m_insertDirection & InsertProxyModel::InsertRow;
    if (!((isRow && canInsRow) || (!isRow && canInsCol)))
        return false;
    const int sourceCols = q->sourceModel()->columnCount();
    const int sourceRows = q->sourceModel()->rowCount();
    if (!(isRow ? q->sourceModel()->insertRow(sourceRows) : q->sourceModel()->insertColumn(sourceCols)))
        return false;
    const int loopEnd = isRow ? sourceCols : sourceRows;
    for (int i = 0; i < loopEnd; ++i) {
        RolesContainer &allRoles = m_extraData[isRow][i];
        if (allRoles.isEmpty())
            continue;
        const QModelIndex currentIdx = isRow ? q->sourceModel()->index(sourceRows, i) : q->sourceModel()->index(i, sourceCols);
        Q_ASSERT(m_separateEditDisplay || (allRoles.contains(Qt::DisplayRole) == allRoles.contains(Qt::EditRole)));
        Q_ASSERT(m_separateEditDisplay || (allRoles.value(Qt::DisplayRole) == allRoles.value(Qt::EditRole)));
        if (!q->sourceModel()->setItemData(currentIdx, convertFromContainer<QMap<int, QVariant>>(allRoles)))
            return false;
        QVector<int> aggregateRoles;
        aggregateRoles.reserve(allRoles.size());
        for (auto j = allRoles.begin(); !allRoles.isEmpty(); j = allRoles.erase(j))
            aggregateRoles << j.key();
        const QModelIndex proxyIdx = isRow ? q->index(sourceRows + 1, i) : q->index(i, sourceCols + 1);
        Q_EMIT q->dataChanged(proxyIdx, proxyIdx, aggregateRoles);
        Q_EMIT q->extraDataChanged(proxyIdx, proxyIdx, aggregateRoles);
    }
    return true;
}